

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O0

int __thiscall
Vgm_Emu_Impl::play_frame(Vgm_Emu_Impl *this,blip_time_t blip_time,int sample_count,sample_t *buf)

{
  bool bVar1;
  fm_time_t fVar2;
  short *in_RCX;
  int in_EDX;
  Vgm_Emu_Impl *in_RDI;
  int pairs;
  int vgm_time;
  int min_pairs;
  blip_time_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int local_20;
  
  local_20 = (int)(((long)(in_EDX >> 1) << 0xc) / (long)in_RDI->fm_time_factor) + -1;
  while (fVar2 = to_fm_time(in_RDI,local_20), fVar2 < in_EDX >> 1) {
    local_20 = local_20 + 1;
  }
  bVar1 = Ym_Emu<Ym2612_Emu>::enabled(&in_RDI->ym2612);
  if (bVar1) {
    Ym_Emu<Ym2612_Emu>::begin_frame(&in_RDI->ym2612,in_RCX);
    memset(in_RCX,0,(long)(fVar2 << 1) << 1);
  }
  else {
    bVar1 = Ym_Emu<Ym2413_Emu>::enabled(&in_RDI->ym2413);
    if (bVar1) {
      Ym_Emu<Ym2413_Emu>::begin_frame(&in_RDI->ym2413,in_RCX);
    }
  }
  run_commands(this,blip_time);
  Ym_Emu<Ym2612_Emu>::run_until
            ((Ym_Emu<Ym2612_Emu> *)CONCAT44(fVar2,in_stack_ffffffffffffffd8),
             (int)((ulong)in_RDI >> 0x20));
  Ym_Emu<Ym2413_Emu>::run_until
            ((Ym_Emu<Ym2413_Emu> *)CONCAT44(fVar2,in_stack_ffffffffffffffd8),
             (int)((ulong)in_RDI >> 0x20));
  in_RDI->fm_time_offset =
       (long)(local_20 * in_RDI->fm_time_factor) + in_RDI->fm_time_offset + (long)fVar2 * -0x1000;
  Sms_Apu::end_frame((Sms_Apu *)in_RDI,in_stack_ffffffffffffffcc);
  return fVar2 << 1;
}

Assistant:

int Vgm_Emu_Impl::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	// to do: timing is working mostly by luck
	
	int min_pairs = sample_count >> 1;
	int vgm_time = ((long) min_pairs << fm_time_bits) / fm_time_factor - 1;
	assert( to_fm_time( vgm_time ) <= min_pairs );
	int pairs = min_pairs;
	while ( (pairs = to_fm_time( vgm_time )) < min_pairs )
		vgm_time++;
	//debug_printf( "pairs: %d, min_pairs: %d\n", pairs, min_pairs );
	
	if ( ym2612.enabled() )
	{
		ym2612.begin_frame( buf );
		memset( buf, 0, pairs * stereo * sizeof *buf );
	}
	else if ( ym2413.enabled() )
	{
		ym2413.begin_frame( buf );
	}
	
	run_commands( vgm_time );
	ym2612.run_until( pairs );
	ym2413.run_until( pairs );
	
	fm_time_offset = (vgm_time * fm_time_factor + fm_time_offset) -
			((long) pairs << fm_time_bits);
	
	psg.end_frame( blip_time );
	
	return pairs * stereo;
}